

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::Flush
          (DeviceContextVkImpl *this,Uint32 NumCommandLists,ICommandList **ppCommandLists)

{
  VulkanCommandBuffer *CmdBuff;
  Uint32 *pUVar1;
  Uint8 *Args_2;
  pointer *pppVVar2;
  atomic<unsigned_long> *paVar3;
  ResourceBindInfo *pRVar4;
  ShaderResourceCacheVk **ppSVar5;
  byte bVar6;
  undefined4 uVar7;
  ICommandList *pSrcPtr;
  pointer ppVar8;
  FenceVkImpl *pFVar9;
  iterator iVar10;
  VkSemaphore_T *pVVar11;
  iterator iVar12;
  RenderDeviceVkImpl *pRVar13;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *pRVar14;
  pointer pRVar15;
  pointer pRVar16;
  pointer pRVar17;
  pointer pRVar18;
  pointer puVar19;
  pointer puVar20;
  pointer pVVar21;
  ulong uVar22;
  ShaderResourceCacheVk *pSVar23;
  ShaderResourceCacheVk *pSVar24;
  ShaderResourceCacheVk *pSVar25;
  ShaderResourceCacheVk *pSVar26;
  ShaderResourceCacheVk *pSVar27;
  ShaderResourceCacheVk *pSVar28;
  ShaderResourceCacheVk *pSVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  SoftwareQueueIndex SVar33;
  Uint32 UVar34;
  int iVar35;
  VkSemaphore_T **ppVVar36;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *FenceValue;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  DeviceContextVkImpl *this_01;
  char (*in_RCX) [14];
  VkCommandBuffer_T *Args_1;
  char (*Args_1_00) [94];
  char (*Args_1_01) [64];
  char (*Args_1_02) [56];
  char (*Args_1_03) [58];
  char (*Args_1_04) [62];
  pointer ppVVar37;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *pSignalFences;
  ulong uVar38;
  bool bVar39;
  long lVar40;
  undefined1 *puVar41;
  long lVar42;
  iterator iVar43;
  char (*in_R8) [94];
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Sem;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this_02;
  pointer ppVar44;
  ulong uVar45;
  long lVar46;
  pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *val_fence;
  pointer ppVar47;
  pointer this_03;
  pointer pRVar48;
  array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL> *paVar49;
  undefined1 *puVar50;
  char (*in_stack_fffffffffffff8e8) [2];
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> vkCmdBuffs;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  DeferredCtxs;
  VkCommandBuffer vkCmdBuff;
  Uint32 local_6ac;
  VkSubmitInfo SubmitInfo;
  VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo;
  string msg;
  undefined8 local_5e0 [4];
  undefined1 local_5c0 [128];
  undefined8 local_540 [4];
  undefined8 local_520;
  undefined1 auStack_518 [24];
  undefined1 local_500 [232];
  undefined8 auStack_418 [85];
  undefined1 local_170 [320];
  
  uVar22 = (ulong)NumCommandLists;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
    FormatString<char[54]>
              (&msg,(char (*) [54])"Flush() should only be called for immediate contexts.");
    in_RCX = (char (*) [14])0x59e;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x59e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_ActiveQueriesCounter != 0) {
    FormatString<char[34],int,char[94]>
              (&msg,(Diligent *)"Flushing device context that has ",
               (char (*) [34])&this->m_ActiveQueriesCounter,
               (int *)
               " active queries. Vulkan requires that queries are begun and ended in the same command buffer."
               ,in_R8);
    in_RCX = (char (*) [14])0x5a2;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[54]>
              (&msg,(char (*) [54])"Flushing device context inside an active render pass.");
    in_RCX = (char (*) [14])0x5a5;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::reserve
            (&vkCmdBuffs,uVar22 + 1);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::reserve(&DeferredCtxs,uVar22 + 1);
  CmdBuff = &this->m_CommandBuffer;
  vkCmdBuff = (this->m_CommandBuffer).m_VkCmdBuffer;
  if (vkCmdBuff != (VkCommandBuffer)0x0) {
    if (this->m_pQueryMgr != (QueryManagerVk *)0x0) {
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
        FormatString<char[26],char[14]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!IsDeferred()",
                   in_RCX);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5b2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      UVar34 = QueryManagerVk::ResetStaleQueries
                         (this->m_pQueryMgr,
                          (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                           m_pObject)->m_LogicalVkDevice).
                          super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,CmdBuff);
      pUVar1 = &(this->m_State).NumCommands;
      *pUVar1 = *pUVar1 + UVar34;
    }
    if ((this->m_State).NumCommands != 0) {
      EndRenderScope(this);
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount != 0) {
        FormatString<char[37]>(&msg,(char (*) [37])"Not all debug groups have been ended");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5bd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount = 0;
      VulkanUtilities::VulkanCommandBuffer::FlushBarriers(CmdBuff);
      VulkanUtilities::VulkanCommandBuffer::EndCommandBuffer(CmdBuff);
      if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>>::
        _M_realloc_insert<VkCommandBuffer_T*const&>
                  ((vector<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>> *)&vkCmdBuffs,
                   (iterator)
                   vkCmdBuffs.
                   super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&vkCmdBuff);
      }
      else {
        *vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = vkCmdBuff;
        vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             vkCmdBuffs.
             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  local_6ac = NumCommandLists;
  if (NumCommandLists != 0) {
    Args_2 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId;
    uVar45 = 0;
    do {
      pSrcPtr = ppCommandLists[uVar45];
      if ((pSrcPtr == (ICommandList *)0x0) ||
         (CheckDynamicType<Diligent::CommandListVkImpl,Diligent::ICommandList>(pSrcPtr),
         pSrcPtr == (ICommandList *)0x0)) {
        FormatString<char[30]>(&msg,(char (*) [30])"Command list must not be null");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5cc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      bVar6 = *(byte *)&pSrcPtr[6].super_IDeviceObject.super_IObject._vptr_IObject;
      if (bVar6 != *Args_2) {
        SubmitInfo.sType = (uint)bVar6;
        FormatString<char[35],unsigned_int,char[27],unsigned_char,char[2]>
                  (&msg,(Diligent *)"Command list recorded for QueueId ",(char (*) [35])&SubmitInfo,
                   (uint *)", but executed on QueueId ",(char (*) [27])Args_2,".",
                   in_stack_fffffffffffff8e8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5cd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (DeferredCtxs.
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          DeferredCtxs.
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
        ::_M_realloc_insert<>
                  (&DeferredCtxs,
                   (iterator)
                   DeferredCtxs.
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        (DeferredCtxs.
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_pObject = (IDeviceContext *)0x0;
        DeferredCtxs.
        super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             DeferredCtxs.
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::_M_realloc_insert<>
                  (&vkCmdBuffs,
                   (iterator)
                   vkCmdBuffs.
                   super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        *vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = (VkCommandBuffer_T *)0x0;
        vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             vkCmdBuffs.
             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      Args_1 = (VkCommandBuffer_T *)pSrcPtr[8].super_IDeviceObject.super_IObject._vptr_IObject;
      vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] = Args_1;
      RefCntAutoPtr<Diligent::IDeviceContext>::operator=
                (DeferredCtxs.
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 (RefCntAutoPtr<Diligent::IDeviceContext> *)(pSrcPtr + 7));
      pSrcPtr[8].super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)0x0;
      if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == (VkCommandBuffer_T *)0x0) {
        FormatString<char[39]>(&msg,(char (*) [39])"Trying to execute empty command buffer");
        Args_1 = (VkCommandBuffer_T *)0x5d1;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5d1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (DeferredCtxs.
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].m_pObject == (IDeviceContext *)0x0) {
        FormatString<char[26],char[31]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DeferredCtxs.back() != nullptr",(char (*) [31])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5d2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      uVar45 = uVar45 + 1;
    } while (uVar22 != uVar45);
  }
  Args_1_00 = (char (*) [94])
              ((long)(this->m_WaitManagedSemaphores).
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_WaitManagedSemaphores).
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((char *)((long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) !=
      *Args_1_00 +
      ((long)(this->m_WaitRecycledSemaphores).
             super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_WaitRecycledSemaphores).
             super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    FormatString<char[26],char[94]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size()"
               ,Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1_01 = (char (*) [64])
              ((long)(this->m_SignalManagedSemaphores).
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_SignalManagedSemaphores).
                    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if ((char (*) [64])
      ((long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start) != Args_1_01) {
    FormatString<char[26],char[64]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size()",
               Args_1_01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  ppVar47 = (this->m_SignalFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_SignalFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar47 == ppVar8) {
    bVar39 = false;
  }
  else {
    bVar39 = false;
    do {
      pFVar9 = (ppVar47->second).m_pObject;
      if ((pFVar9->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
        FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                  (&pFVar9->super_FenceBase<Diligent::EngineVkImplTraits>,ppVar47->first);
        msg._M_dataplus._M_p = (pointer)(pFVar9->m_TimelineSemaphore).m_VkObject;
        iVar43._M_current =
             (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar43._M_current ==
            (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkSignalSemaphores,iVar43,(VkSemaphore_T **)&msg);
        }
        else {
          *iVar43._M_current = (VkSemaphore_T *)msg._M_dataplus._M_p;
          pppVVar2 = &(this->m_VkSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
        iVar10._M_current =
             (this->m_SignalSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          bVar39 = true;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->m_SignalSemaphoreValues,iVar10,&ppVar47->first);
        }
        else {
          *iVar10._M_current = ppVar47->first;
          (this->m_SignalSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
          bVar39 = true;
        }
      }
      ppVar47 = ppVar47 + 1;
    } while (ppVar47 != ppVar8);
  }
  ppVar47 = (this->m_WaitFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_WaitFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar47 != ppVar8) {
    do {
      pFVar9 = (ppVar47->second).m_pObject;
      FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
                (&pFVar9->super_FenceBase<Diligent::EngineVkImplTraits>,ppVar47->first);
      pVVar11 = (pFVar9->m_TimelineSemaphore).m_VkObject;
      if (pVVar11 == (VkSemaphore_T *)0x0) {
        SVar33 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        FenceVkImpl::ExtractSignalSemaphore
                  ((VulkanRecycledSemaphore *)&msg,pFVar9,SVar33,ppVar47->first);
        if (msg.field_2._M_allocated_capacity != 0) {
          SubmitInfo._0_8_ = msg.field_2._M_allocated_capacity;
          iVar43._M_current =
               (this->m_VkWaitSemaphores).
               super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar43._M_current ==
              (this->m_VkWaitSemaphores).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
            _M_realloc_insert<VkSemaphore_T*>
                      ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                       &this->m_VkWaitSemaphores,iVar43,(VkSemaphore_T **)&SubmitInfo);
          }
          else {
            *iVar43._M_current = (VkSemaphore_T *)msg.field_2._M_allocated_capacity;
            pppVVar2 = &(this->m_VkWaitSemaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppVVar2 = *pppVVar2 + 1;
          }
          SubmitInfo.sType = 0x10000;
          iVar12._M_current =
               (this->m_WaitDstStageMasks).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar12._M_current ==
              (this->m_WaitDstStageMasks).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->m_WaitDstStageMasks,iVar12,&SubmitInfo.sType);
          }
          else {
            *iVar12._M_current = 0x10000;
            (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar12._M_current + 1;
          }
          std::
          vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
          ::
          emplace_back<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
                    ((vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
                      *)&this->m_WaitRecycledSemaphores,
                     (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg);
          SubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          SubmitInfo._4_4_ = 0;
          iVar10._M_current =
               (this->m_WaitSemaphoreValues).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar10._M_current ==
              (this->m_WaitSemaphoreValues).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&this->m_WaitSemaphoreValues,iVar10,(unsigned_long *)&SubmitInfo);
          }
          else {
            *iVar10._M_current = 0;
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar10._M_current + 1;
          }
        }
        VulkanUtilities::VulkanSyncObjectManager::
        RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject
                  ((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg);
      }
      else {
        ppVVar36 = (this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        iVar43._M_current =
             (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        SubmitInfo._0_8_ = pVVar11;
        if (iVar43._M_current != ppVVar36) {
          lVar42 = 0;
          uVar45 = 0;
          do {
            if (ppVVar36[uVar45] == (VkSemaphore_T *)SubmitInfo._0_8_) {
              FormatString<char[8],char_const*,char[15],unsigned_long,char[50],unsigned_long,char[2]>
                        (&msg,(Diligent *)"Fence \'",
                         (char (*) [8])
                         &(pFVar9->super_FenceBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                          .m_Desc,(char **)"\' with value (",(char (*) [15])ppVar47,
                         (unsigned_long *)") is already added to wait operation with value (",
                         (char (*) [50])
                         ((long)(this->m_WaitSemaphoreValues).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar42),
                         (unsigned_long *)0x752f31,in_stack_fffffffffffff8e8);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
            }
            uVar45 = uVar45 + 1;
            ppVVar36 = (this->m_VkWaitSemaphores).
                       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            iVar43._M_current =
                 (this->m_VkWaitSemaphores).
                 super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            lVar42 = lVar42 + 8;
          } while (uVar45 < (ulong)((long)iVar43._M_current - (long)ppVVar36 >> 3));
        }
        if (iVar43._M_current ==
            (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*const&>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkWaitSemaphores,iVar43,(VkSemaphore_T **)&SubmitInfo);
        }
        else {
          *iVar43._M_current = (VkSemaphore_T *)SubmitInfo._0_8_;
          pppVVar2 = &(this->m_VkWaitSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar2 = *pppVVar2 + 1;
        }
        msg._M_dataplus._M_p._0_4_ = 0x10000;
        iVar12._M_current =
             (this->m_WaitDstStageMasks).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar12._M_current ==
            (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->m_WaitDstStageMasks,iVar12,(uint *)&msg);
        }
        else {
          *iVar12._M_current = 0x10000;
          (this->m_WaitDstStageMasks).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar12._M_current + 1;
        }
        iVar10._M_current =
             (this->m_WaitSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->m_WaitSemaphoreValues,iVar10,&ppVar47->first);
        }
        else {
          *iVar10._M_current = ppVar47->first;
          (this->m_WaitSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar10._M_current + 1;
        }
        bVar39 = true;
      }
      ppVar47 = ppVar47 + 1;
    } while (ppVar47 != ppVar8);
  }
  Args_1_02 = (char (*) [56])
              ((long)(this->m_WaitDstStageMasks).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_WaitDstStageMasks).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
  if ((char (*) [56])
      ((long)(this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) != Args_1_02) {
    FormatString<char[26],char[56]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size()",Args_1_02);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x608);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1_03 = (char (*) [58])
              ((long)(this->m_WaitSemaphoreValues).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_WaitSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if ((char (*) [58])
      ((long)(this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start) != Args_1_03) {
    FormatString<char[26],char[58]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size()",Args_1_03)
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x609);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1_04 = (char (*) [62])
              ((long)(this->m_SignalSemaphoreValues).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_SignalSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if ((char (*) [62])
      ((long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start) != Args_1_04) {
    FormatString<char[26],char[62]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size()",
               Args_1_04);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x60a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  ppVVar37 = (pointer)0x0;
  SubmitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  SubmitInfo._4_4_ = 0;
  SubmitInfo.pNext = (void *)0x0;
  SubmitInfo._40_8_ =
       (ulong)((long)vkCmdBuffs.
                     super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)vkCmdBuffs.
                    super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  SubmitInfo.pCommandBuffers =
       vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  SubmitInfo.pWaitSemaphores =
       (this->m_VkWaitSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar45 = (ulong)((long)(this->m_VkWaitSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)SubmitInfo.pWaitSemaphores) >> 3;
  iVar35 = (int)uVar45;
  SubmitInfo._16_8_ = uVar45 & 0xffffffff;
  if (iVar35 == 0) {
    SubmitInfo.pWaitSemaphores = ppVVar37;
  }
  SubmitInfo.pWaitDstStageMask =
       (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  if (iVar35 == 0) {
    SubmitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)ppVVar37;
  }
  SubmitInfo.pSignalSemaphores =
       (this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar38 = (ulong)((long)(this->m_VkSignalSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)SubmitInfo.pSignalSemaphores) >> 3;
  SubmitInfo._56_8_ = uVar38 & 0xffffffff;
  if ((int)uVar38 == 0) {
    SubmitInfo.pSignalSemaphores = ppVVar37;
  }
  TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = 0;
  TimelineSemaphoreSubmitInfo._36_4_ = 0;
  TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues = (uint64_t *)0x0;
  TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount = 0;
  TimelineSemaphoreSubmitInfo._20_4_ = 0;
  TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues = (uint64_t *)0x0;
  TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  TimelineSemaphoreSubmitInfo._4_4_ = 0;
  if (bVar39) {
    TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues = (uint64_t *)0x0;
    SubmitInfo.pNext = &TimelineSemaphoreSubmitInfo;
    TimelineSemaphoreSubmitInfo.sType = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
    TimelineSemaphoreSubmitInfo._4_4_ = 0;
    TimelineSemaphoreSubmitInfo._16_8_ = uVar45 & 0xffffffff;
    TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues = (pointer)0x0;
    if (iVar35 != 0) {
      TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues =
           (this->m_WaitSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    TimelineSemaphoreSubmitInfo._32_8_ = uVar38 & 0xffffffff;
    if ((int)uVar38 != 0) {
      TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues =
           (this->m_SignalSemaphoreValues).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  TimelineSemaphoreSubmitInfo.pNext = (void *)0x0;
  pRVar13 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  SVar33 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                     (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  pSignalFences = &this->m_SignalFences;
  FenceValue = (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                *)RenderDeviceVkImpl::ExecuteCommandBuffer(pRVar13,SVar33,&SubmitInfo,pSignalFences)
  ;
  pRVar13 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  SVar33 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                     (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  this_00 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&pRVar13->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,SVar33);
  pRVar14 = (this->m_WaitRecycledSemaphores).
            super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->m_WaitRecycledSemaphores).
                 super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pRVar14;
      this_02 = this_02 + 1) {
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    SetUnsignaled(this_02);
    ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
    DiscardResource<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
              (this_00,this_02,(Uint64)FenceValue);
  }
  pRVar15 = (this->m_WaitRecycledSemaphores).
            super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar16 = (this->m_WaitRecycledSemaphores).
            super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_03 = pRVar15;
  if (pRVar16 != pRVar15) {
    do {
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != pRVar16);
    (this->m_WaitRecycledSemaphores).
    super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar15;
  }
  pRVar17 = (this->m_WaitManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar18 = (this->m_WaitManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pRVar48 = pRVar17;
  if (pRVar18 != pRVar17) {
    do {
      RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
      ::Release(pRVar48);
      pRVar48 = pRVar48 + 1;
    } while (pRVar48 != pRVar18);
    (this->m_WaitManagedSemaphores).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar17;
  }
  puVar19 = (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar19) {
    (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar19;
  }
  pRVar17 = (this->m_SignalManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar18 = (this->m_SignalManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pRVar48 = pRVar17;
  if (pRVar18 != pRVar17) {
    do {
      RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
      ::Release(pRVar48);
      pRVar48 = pRVar48 + 1;
    } while (pRVar48 != pRVar18);
    (this->m_SignalManagedSemaphores).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar17;
  }
  ppVVar37 = (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar37) {
    (this->m_VkWaitSemaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVVar37;
  }
  ppVVar37 = (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar37) {
    (this->m_VkSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar37;
  }
  ppVar47 = (this->m_SignalFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_SignalFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar44 = ppVar47;
  if (ppVar8 != ppVar47) {
    do {
      RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&ppVar44->second);
      ppVar44 = ppVar44 + 1;
    } while (ppVar44 != ppVar8);
    (this->m_SignalFences).
    super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar47;
  }
  ppVar47 = (this->m_WaitFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->m_WaitFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar44 = ppVar47;
  if (ppVar8 != ppVar47) {
    do {
      RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&ppVar44->second);
      ppVar44 = ppVar44 + 1;
    } while (ppVar44 != ppVar8);
    (this->m_WaitFences).
    super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar47;
  }
  puVar20 = (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar20) {
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar20;
  }
  puVar20 = (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar20) {
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar20;
  }
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    lVar42 = 0;
  }
  else {
    pSignalFences =
         (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
          *)vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (*vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_start != vkCmdBuff) {
      FormatString<char[26],char[34]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"vkCmdBuffs[buff_idx] == vkCmdBuff",
                 (char (*) [34])
                 vkCmdBuffs.
                 super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      pSignalFences =
           (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            *)0x63f;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x63f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    SVar33 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    lVar42 = 1;
    DisposeCurrentCmdBuffer(this,SVar33,(Uint64)FenceValue);
  }
  if (local_6ac != 0) {
    lVar40 = -lVar42;
    lVar46 = 0;
    do {
      this_01 = RefCntAutoPtr<Diligent::IDeviceContext>::RawPtr<Diligent::DeviceContextVkImpl>
                          ((RefCntAutoPtr<Diligent::IDeviceContext> *)
                           ((long)&(DeferredCtxs.
                                    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_pObject + lVar46))
      ;
      SVar33 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      LOCK();
      paVar3 = &(this_01->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                m_SubmittedBuffersCmdQueueMask;
      (paVar3->super___atomic_base<unsigned_long>)._M_i =
           (paVar3->super___atomic_base<unsigned_long>)._M_i | 1L << (SVar33.m_Value & 0x3f);
      UNLOCK();
      SVar33 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      pSignalFences = FenceValue;
      DisposeVkCmdBuffer(this_01,SVar33,
                         *(VkCommandBuffer *)
                          ((long)vkCmdBuffs.
                                 super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                          lVar46 + (ulong)(uint)((int)lVar42 << 3)),(Uint64)FenceValue);
      lVar46 = lVar46 + 8;
      lVar40 = lVar40 + -1;
    } while (uVar22 << 3 != lVar46);
    lVar42 = -lVar40;
  }
  if (lVar42 != (long)vkCmdBuffs.
                      super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)vkCmdBuffs.
                      super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) {
    FormatString<char[26],char[30]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"buff_idx == vkCmdBuffs.size()",(char (*) [30])pSignalFences);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x64d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  puVar41 = local_500;
  lVar42 = 0;
  do {
    memset((void *)((long)local_5e0 + lVar42 + -0x20),0,0xe4);
    lVar40 = 0;
    do {
      *(undefined8 *)(puVar41 + lVar40 + -0x18) = 0;
      *(undefined8 *)((long)(puVar41 + lVar40 + -0x18) + 8) = 0;
      *(undefined8 *)(puVar41 + lVar40 + -8) = 0;
      *(undefined4 *)(puVar41 + lVar40) = 0xffffffff;
      lVar40 = lVar40 + 0x20;
    } while (lVar40 != 0x100);
    *(undefined8 *)((long)auStack_418 + lVar42) = 0;
    lVar42 = lVar42 + 0x1f0;
    puVar41 = puVar41 + 0x1f0;
  } while (lVar42 != 0x5d0);
  puVar41 = local_5c0;
  paVar49 = &(this->m_BindInfo)._M_elems[0].super_CommittedShaderResources.SRBs;
  lVar42 = 0;
  do {
    pSVar23 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e + -4];
    pSVar24 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e + -3];
    pSVar25 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e + -2];
    pSVar26 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e + -1];
    pSVar27 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e];
    pSVar28 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e + 1];
    pSVar29 = *(ShaderResourceCacheVk **)(local_5c0 + lVar42 * 0x1f0 + -8);
    ppSVar5 = (this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 6;
    *ppSVar5 = (ShaderResourceCacheVk *)local_5e0[lVar42 * 0x3e + 2];
    ppSVar5[1] = pSVar29;
    ppSVar5 = (this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 4;
    *ppSVar5 = pSVar27;
    ppSVar5[1] = pSVar28;
    ppSVar5 = (this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 2;
    *ppSVar5 = pSVar25;
    ppSVar5[1] = pSVar26;
    pRVar4 = (this->m_BindInfo)._M_elems + lVar42;
    (pRVar4->super_CommittedShaderResources).ResourceCaches._M_elems[0] = pSVar23;
    (pRVar4->super_CommittedShaderResources).ResourceCaches._M_elems[1] = pSVar24;
    lVar40 = 0;
    do {
      if (*(long *)((long)&paVar49->_M_elems[0].m_pRefCounters + lVar40) !=
          *(long *)(puVar41 + lVar40)) {
        RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                  ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)
                   ((long)&paVar49->_M_elems[0].m_pRefCounters + lVar40));
        *(undefined8 *)((long)&paVar49->_M_elems[0].m_pObject + lVar40) =
             *(undefined8 *)(puVar41 + lVar40 + 8);
        *(undefined8 *)((long)&paVar49->_M_elems[0].m_pRefCounters + lVar40) =
             *(undefined8 *)(puVar41 + lVar40);
        *(undefined8 *)(puVar41 + lVar40) = 0;
        *(undefined8 *)((long)(puVar41 + lVar40) + 8) = 0;
      }
      lVar40 = lVar40 + 0x10;
    } while (lVar40 != 0x80);
    uVar7 = *(undefined4 *)(&local_520 + lVar42 * 0x3e);
    pRVar4 = (this->m_BindInfo)._M_elems + lVar42;
    (pRVar4->super_CommittedShaderResources).ResourcesValidated = (bool)(char)uVar7;
    (pRVar4->super_CommittedShaderResources).ActiveSRBMask = (char)((uint)uVar7 >> 8);
    (pRVar4->super_CommittedShaderResources).StaleSRBMask = (char)((uint)uVar7 >> 0x10);
    (pRVar4->super_CommittedShaderResources).DynamicSRBMask = (char)((uint)uVar7 >> 0x18);
    uVar30 = local_540[lVar42 * 0x3e];
    uVar31 = local_540[lVar42 * 0x3e + 1];
    uVar32 = (&local_520)[lVar42 * 0x3e + -1];
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.CacheRevisions._M_elems + 4
     ) = local_540[lVar42 * 0x3e + 2];
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.CacheRevisions._M_elems + 6
     ) = uVar32;
    *(undefined8 *)
     (this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.CacheRevisions._M_elems =
         uVar30;
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar42].super_CommittedShaderResources.CacheRevisions._M_elems + 2
     ) = uVar31;
    memcpy(&(this->m_BindInfo)._M_elems[lVar42].SetInfo,auStack_518 + lVar42 * 0x1f0,0x108);
    lVar42 = lVar42 + 1;
    puVar41 = puVar41 + 0x1f0;
    paVar49 = (array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL> *)
              ((long)(paVar49 + 3) + 0x70);
  } while (lVar42 != 3);
  puVar41 = &stack0xffffffffffffffd0;
  puVar50 = local_170;
  do {
    puVar41 = puVar41 + -0x1f0;
    lVar42 = 0;
    do {
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)(puVar50 + lVar42));
      lVar42 = lVar42 + -0x10;
    } while (lVar42 != -0x80);
    puVar50 = puVar50 + -0x1f0;
  } while ((string *)puVar41 != &msg);
  (this->m_CommandBuffer).m_State.IndexBuffer = (VkBuffer)0x0;
  (this->m_CommandBuffer).m_State.IndexBufferOffset = 0;
  (this->m_CommandBuffer).m_State.ComputePipeline = (VkPipeline)0x0;
  (this->m_CommandBuffer).m_State.RayTracingPipeline = (VkPipeline)0x0;
  (this->m_CommandBuffer).m_State.Framebuffer = (VkFramebuffer)0x0;
  (this->m_CommandBuffer).m_State.GraphicsPipeline = (VkPipeline)0x0;
  CmdBuff->m_VkCmdBuffer = (VkCommandBuffer)0x0;
  (this->m_CommandBuffer).m_State.RenderPass = (VkRenderPass)0x0;
  (this->m_CommandBuffer).m_State.IndexType = VK_INDEX_TYPE_MAX_ENUM;
  (this->m_CommandBuffer).m_State.FramebufferWidth = 0;
  (this->m_CommandBuffer).m_State.FramebufferHeight = 0;
  (this->m_CommandBuffer).m_State.InsidePassQueries = 0;
  (this->m_CommandBuffer).m_State.OutsidePassQueries = 0;
  (this->m_CommandBuffer).m_State.DynamicRenderingHash = 0;
  (this->m_CommandBuffer).m_Barrier.MemorySrcStages = 0;
  (this->m_CommandBuffer).m_Barrier.MemoryDstStages = 0;
  (this->m_CommandBuffer).m_Barrier.MemorySrcAccess = 0;
  (this->m_CommandBuffer).m_Barrier.MemoryDstAccess = 0;
  (this->m_CommandBuffer).m_Barrier.ImageSrcStages = 0;
  (this->m_CommandBuffer).m_Barrier.ImageDstStages = 0;
  (this->m_CommandBuffer).m_Barrier.SupportedStagesMask = 0xffffffff;
  (this->m_CommandBuffer).m_Barrier.SupportedAccessMask = 0xffffffff;
  pVVar21 = (this->m_CommandBuffer).m_ImageBarriers.
            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_CommandBuffer).m_ImageBarriers.
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar21) {
    (this->m_CommandBuffer).m_ImageBarriers.
    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar21;
  }
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState,
             (PipelineStateVkImpl *)0x0);
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass,
             (RenderPassVkImpl *)0x0);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer,
             (FramebufferVkImpl *)0x0);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::~vector(&DeferredCtxs);
  if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkCmdBuffs.
                    super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vkCmdBuffs.
                          super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkCmdBuffs.
                          super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::Flush(Uint32               NumCommandLists,
                                ICommandList* const* ppCommandLists)
{
    DEV_CHECK_ERR(!IsDeferred(), "Flush() should only be called for immediate contexts.");

    DEV_CHECK_ERR(m_ActiveQueriesCounter == 0,
                  "Flushing device context that has ", m_ActiveQueriesCounter,
                  " active queries. Vulkan requires that queries are begun and ended in the same command buffer.");

    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                  "Flushing device context inside an active render pass.");

    // TODO: replace with small_vector
    std::vector<VkCommandBuffer>               vkCmdBuffs;
    std::vector<RefCntAutoPtr<IDeviceContext>> DeferredCtxs;
    vkCmdBuffs.reserve(size_t{NumCommandLists} + 1);
    DeferredCtxs.reserve(size_t{NumCommandLists} + 1);

    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        if (m_pQueryMgr != nullptr)
        {
            VERIFY_EXPR(!IsDeferred());
            // Note that vkCmdResetQueryPool must be called outside of a render pass,
            // so it is better to reset all queries at once at the end of the command buffer.
            m_State.NumCommands += m_pQueryMgr->ResetStaleQueries(m_pDevice->GetLogicalDevice(), m_CommandBuffer);
        }

        if (m_State.NumCommands != 0)
        {
            EndRenderScope();

#ifdef DILIGENT_DEVELOPMENT
            DEV_CHECK_ERR(m_DvpDebugGroupCount == 0, "Not all debug groups have been ended");
            m_DvpDebugGroupCount = 0;
#endif

            m_CommandBuffer.FlushBarriers();
            m_CommandBuffer.EndCommandBuffer();

            vkCmdBuffs.push_back(vkCmdBuff);
        }
    }

    // Add command buffers from deferred contexts
    for (Uint32 i = 0; i < NumCommandLists; ++i)
    {
        CommandListVkImpl* pCmdListVk = ClassPtrCast<CommandListVkImpl>(ppCommandLists[i]);
        DEV_CHECK_ERR(pCmdListVk != nullptr, "Command list must not be null");
        DEV_CHECK_ERR(pCmdListVk->GetQueueId() == GetDesc().QueueId, "Command list recorded for QueueId ", pCmdListVk->GetQueueId(), ", but executed on QueueId ", GetDesc().QueueId, ".");
        DeferredCtxs.emplace_back();
        vkCmdBuffs.emplace_back();
        pCmdListVk->Close(DeferredCtxs.back(), vkCmdBuffs.back());
        VERIFY(vkCmdBuffs.back() != VK_NULL_HANDLE, "Trying to execute empty command buffer");
        VERIFY_EXPR(DeferredCtxs.back() != nullptr);
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size());

    bool UsedTimelineSemaphore = false;
    for (auto& val_fence : m_SignalFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(val_fence.first);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(val_fence.first);
    }

    for (auto& val_fence : m_WaitFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        pFenceVk->DvpDeviceWait(val_fence.first);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t i = 0; i < m_VkWaitSemaphores.size(); ++i)
            {
                if (m_VkWaitSemaphores[i] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", val_fence.first,
                                      ") is already added to wait operation with value (", m_WaitSemaphoreValues[i], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
            m_WaitSemaphoreValues.push_back(val_fence.first);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), val_fence.first))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size());
    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size());

    VkSubmitInfo SubmitInfo{};
    SubmitInfo.sType                = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    SubmitInfo.pNext                = nullptr;
    SubmitInfo.commandBufferCount   = static_cast<uint32_t>(vkCmdBuffs.size());
    SubmitInfo.pCommandBuffers      = vkCmdBuffs.data();
    SubmitInfo.waitSemaphoreCount   = static_cast<uint32_t>(m_VkWaitSemaphores.size());
    SubmitInfo.pWaitSemaphores      = SubmitInfo.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    SubmitInfo.pWaitDstStageMask    = SubmitInfo.waitSemaphoreCount != 0 ? m_WaitDstStageMasks.data() : nullptr;
    SubmitInfo.signalSemaphoreCount = static_cast<uint32_t>(m_VkSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = SubmitInfo.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        SubmitInfo.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = SubmitInfo.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = SubmitInfo.waitSemaphoreCount ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = SubmitInfo.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = SubmitInfo.signalSemaphoreCount ? m_SignalSemaphoreValues.data() : nullptr;
    }

    // Submit command buffer even if there are no commands to release stale resources.
    Uint64 SubmittedFenceValue = m_pDevice->ExecuteCommandBuffer(GetCommandQueueId(), SubmitInfo, &m_SignalFences);

    // Recycle semaphores
    {
        auto& ReleaseQueue = m_pDevice->GetReleaseQueue(GetCommandQueueId());
        for (auto& Sem : m_WaitRecycledSemaphores)
        {
            Sem.SetUnsignaled();
            ReleaseQueue.DiscardResource(std::move(Sem), SubmittedFenceValue);
        }
        m_WaitRecycledSemaphores.clear();
    }

    m_WaitManagedSemaphores.clear();
    m_WaitDstStageMasks.clear();
    m_SignalManagedSemaphores.clear();
    m_VkWaitSemaphores.clear();
    m_VkSignalSemaphores.clear();
    m_SignalFences.clear();
    m_WaitFences.clear();
    m_WaitSemaphoreValues.clear();
    m_SignalSemaphoreValues.clear();

    size_t buff_idx = 0;
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(vkCmdBuffs[buff_idx] == vkCmdBuff);
        DisposeCurrentCmdBuffer(GetCommandQueueId(), SubmittedFenceValue);
        ++buff_idx;
    }

    for (Uint32 i = 0; i < NumCommandLists; ++i, ++buff_idx)
    {
        DeviceContextVkImpl* pDeferredCtxVkImpl = DeferredCtxs[i].RawPtr<DeviceContextVkImpl>();
        // Set the bit in the deferred context cmd queue mask corresponding to cmd queue of this context
        pDeferredCtxVkImpl->UpdateSubmittedBuffersCmdQueueMask(GetCommandQueueId());
        // It is OK to dispose command buffer from another thread. We are not going to
        // record any commands and only need to add the buffer to the queue
        pDeferredCtxVkImpl->DisposeVkCmdBuffer(GetCommandQueueId(), std::move(vkCmdBuffs[buff_idx]), SubmittedFenceValue);
    }
    VERIFY_EXPR(buff_idx == vkCmdBuffs.size());

    m_State    = {};
    m_BindInfo = {};
    m_CommandBuffer.Reset();
    m_pPipelineState    = nullptr;
    m_pActiveRenderPass = nullptr;
    m_pBoundFramebuffer = nullptr;
}